

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

ScopedStmtBlock * __thiscall
kratos::SwitchStmt::add_switch_case
          (SwitchStmt *this,shared_ptr<kratos::Const> *switch_case,
          vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
          *stmts)

{
  pointer psVar1;
  mapped_type *pmVar2;
  shared_ptr<kratos::Stmt> *stmt;
  pointer stmt_00;
  
  psVar1 = (stmts->
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (stmt_00 = (stmts->
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; stmt_00 != psVar1;
      stmt_00 = stmt_00 + 1) {
    add_switch_case(this,switch_case,stmt_00);
  }
  pmVar2 = std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::at(&this->body_,switch_case);
  return (pmVar2->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

ScopedStmtBlock &SwitchStmt::add_switch_case(const std::shared_ptr<Const> &switch_case,
                                             const std::vector<std::shared_ptr<Stmt>> &stmts) {
    for (const auto &stmt : stmts) add_switch_case(switch_case, stmt);
    return *body_.at(switch_case);
}